

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O2

void __thiscall
TPZFrontSym<std::complex<long_double>_>::Compress(TPZFrontSym<std::complex<long_double>_> *this)

{
  long *plVar1;
  long *plVar2;
  complex<long_double> *pcVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int64_t iVar18;
  TPZStack<long,_10> from;
  
  TPZStack<long,_10>::TPZStack(&from);
  for (lVar17 = 0; lVar17 < (this->super_TPZFront<std::complex<long_double>_>).fFront;
      lVar17 = lVar17 + 1) {
    if ((this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.fStore[lVar17]
        != -1) {
      TPZStack<long,_10>::Push(&from,lVar17);
    }
  }
  plVar1 = (this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.fStore;
  plVar2 = (this->super_TPZFront<std::complex<long_double>_>).fLocal.fStore;
  lVar10 = 0;
  lVar17 = 0;
  if (0 < from.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements) {
    lVar17 = from.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
  }
  for (; lVar17 != lVar10; lVar10 = lVar10 + 1) {
    lVar12 = plVar1[from.super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[lVar10]];
    plVar1[lVar10] = lVar12;
    plVar2[lVar12] = lVar10;
  }
  plVar1 = (this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.fStore;
  for (lVar10 = lVar17;
      lVar10 < (this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.
               fNElements; lVar10 = lVar10 + 1) {
    plVar1[lVar10] = -1;
  }
  iVar18 = (this->super_TPZFront<std::complex<long_double>_>).fFree.super_TPZManVector<int,_10>.
           super_TPZVec<int>.fNElements +
           from.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
  if (iVar18 != (this->super_TPZFront<std::complex<long_double>_>).fFront) {
    std::operator<<((ostream *)&std::cout,"TPZFront.Compress inconsistent data structure\n");
    iVar18 = (this->super_TPZFront<std::complex<long_double>_>).fFront;
  }
  (this->super_TPZFront<std::complex<long_double>_>).fFront =
       from.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
  TPZManVector<int,_10>::Resize
            (&(this->super_TPZFront<std::complex<long_double>_>).fFree.super_TPZManVector<int,_10>,0
            );
  TPZManVector<long,_10>::Resize
            (&(this->super_TPZFront<std::complex<long_double>_>).fGlobal,
             (this->super_TPZFront<std::complex<long_double>_>).fFront);
  if ((this->super_TPZFront<std::complex<long_double>_>).fData.fNElements != 0) {
    lVar10 = 1;
    lVar12 = 2;
    lVar11 = 0;
    lVar13 = 0;
    while (lVar13 != lVar17) {
      lVar14 = lVar11 << 4;
      for (lVar15 = 0; lVar10 != lVar15; lVar15 = lVar15 + 1) {
        lVar8 = from.super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[lVar15];
        lVar16 = from.super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[lVar13];
        lVar9 = lVar16;
        if (lVar16 < lVar8) {
          lVar9 = lVar8;
        }
        if (lVar8 < lVar16) {
          lVar16 = lVar8;
        }
        lVar8 = ((lVar9 + 1) * lVar9) / 2;
        pcVar3 = (this->super_TPZFront<std::complex<long_double>_>).fData.fStore;
        uVar5 = *(undefined8 *)pcVar3[lVar8 + lVar16]._M_value;
        uVar6 = *(undefined8 *)(pcVar3[lVar8 + lVar16]._M_value + 8);
        uVar7 = *(undefined8 *)((long)(pcVar3[lVar8 + lVar16]._M_value + 0x10) + 8);
        *(undefined8 *)(pcVar3->_M_value + lVar14 + 0x10) =
             *(undefined8 *)(pcVar3[lVar8 + lVar16]._M_value + 0x10);
        *(undefined8 *)((long)(pcVar3->_M_value + lVar14 + 0x10) + 8) = uVar7;
        *(undefined8 *)(pcVar3->_M_value + lVar14) = uVar5;
        *(undefined8 *)((long)(pcVar3->_M_value + lVar14) + 8) = uVar6;
        lVar14 = lVar14 + 0x20;
      }
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + lVar12;
      lVar12 = lVar12 + 2;
      lVar13 = lVar13 + 1;
    }
    while (lVar10 = lVar17, lVar10 < (int)iVar18) {
      for (lVar12 = 0; lVar17 = lVar10 + 1, lVar10 + 1 != lVar12; lVar12 = lVar12 + 1) {
        lVar17 = lVar10;
        if (lVar10 < lVar12) {
          lVar17 = lVar12;
        }
        lVar13 = lVar10;
        if (lVar12 < lVar10) {
          lVar13 = lVar12;
        }
        uVar4 = (lVar17 + 1) * lVar17 & 0xffffffffffffffe;
        pcVar3 = (this->super_TPZFront<std::complex<long_double>_>).fData.fStore;
        *(longdouble *)(pcVar3[lVar13]._M_value + uVar4 * 0x10) = (longdouble)0;
        *(longdouble *)(pcVar3[lVar13]._M_value + uVar4 * 0x10 + 0x10) = (longdouble)0;
      }
    }
  }
  TPZManVector<long,_10>::~TPZManVector(&from.super_TPZManVector<long,_10>);
  return;
}

Assistant:

void TPZFrontSym<TVar>::Compress(){
	//	PrintGlobal("Before COmpress",output);
	//	Print("Before Compress", cout);
	TPZStack <int64_t> from;
	int64_t nfound;
	int64_t i, j;
	for(i = 0; i < this->fFront; i++){
		if(this->fGlobal[i] != -1) from.Push(i);
	}
	
	/**
	 *First this->fLocal initialization
	 *Any needed updates is done on next loop
	 */
	nfound = from.NElements();
	for(i=0;i<nfound;i++) {
		this->fGlobal[i]=this->fGlobal[from[i]];
		//fGlobal[from[i]] = -1;
		this->fLocal[this->fGlobal[i]] = i;
	}
	for(;i<this->fGlobal.NElements();i++) this->fGlobal[i] = -1;
	
	if(nfound+this->fFree.NElements()!=this->fFront) cout << "TPZFront.Compress inconsistent data structure\n";
	int frontold = this->fFront;
	this->fFront = nfound;
	this->fFree.Resize(0);	
	this->fGlobal.Resize(this->fFront);
	if(this->fData.NElements()==0) return;
	
	for(j = 0; j < nfound; j++){
		for(i = 0; i <= j; i++){
			Element(i,j) = Element(from[i], from[j]);
		}
		//		fGlobal[i] = fGlobal[from[i]];
		//		this->fLocal[fGlobal[i]] = i;
	}
	for(;j<frontold;j++) {
		for(i=0;i<= j; i++) Element(i,j) = 0.;
	}
	
	//	Print("After Compress", cout);
	//	PrintGlobal("After Compress",output);
}